

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>::
addStorage(Span<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_> *this)

{
  uchar *puVar1;
  uchar *puVar2;
  byte bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Entry *pEVar7;
  ulong uVar8;
  Entry *pEVar9;
  size_t i;
  ulong uVar10;
  long lVar11;
  ulong uStack_40;
  
  bVar3 = this->allocated;
  uVar8 = (ulong)bVar3;
  if (bVar3 == 0) {
    uStack_40 = 0x30;
  }
  else if (bVar3 == 0x30) {
    uStack_40 = 0x50;
  }
  else {
    uStack_40 = uVar8 + 0x10;
  }
  pEVar7 = (Entry *)operator_new__(uStack_40 * 0x38);
  lVar11 = 0x28;
  for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 1) {
    pEVar9 = this->entries;
    *(undefined8 *)((pEVar7->storage).data + lVar11 + -0x28) =
         *(undefined8 *)((pEVar9->storage).data + lVar11 + -0x28);
    puVar1 = (pEVar9->storage).data + lVar11 + -0x20;
    uVar4 = *(undefined8 *)(puVar1 + 8);
    puVar2 = (pEVar9->storage).data + lVar11 + -0x10;
    uVar5 = *(undefined8 *)puVar2;
    uVar6 = *(undefined8 *)(puVar2 + 8);
    puVar2 = (pEVar7->storage).data + lVar11 + -0x20;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 8) = uVar4;
    puVar1 = (pEVar7->storage).data + lVar11 + -0x10;
    *(undefined8 *)puVar1 = uVar5;
    *(undefined8 *)(puVar1 + 8) = uVar6;
    puVar1 = (pEVar9->storage).data + lVar11;
    uVar4 = *(undefined8 *)(puVar1 + 8);
    puVar2 = (pEVar7->storage).data + lVar11;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 8) = uVar4;
    puVar1 = (pEVar9->storage).data + lVar11;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1[8] = '\0';
    puVar1[9] = '\0';
    puVar1[10] = '\0';
    puVar1[0xb] = '\0';
    puVar1[0xc] = '\0';
    puVar1[0xd] = '\0';
    puVar1[0xe] = '\0';
    puVar1[0xf] = '\0';
    QWeakPointer<QObject>::~QWeakPointer
              ((QWeakPointer<QObject> *)((this->entries->storage).data + lVar11));
    uVar8 = (ulong)this->allocated;
    lVar11 = lVar11 + 0x38;
  }
  pEVar9 = pEVar7 + uVar8;
  while (uVar8 < uStack_40) {
    uVar8 = uVar8 + 1;
    (pEVar9->storage).data[0] = (uchar)uVar8;
    pEVar9 = pEVar9 + 1;
  }
  if (this->entries != (Entry *)0x0) {
    operator_delete__(this->entries);
  }
  this->entries = pEVar7;
  this->allocated = (uchar)uStack_40;
  return;
}

Assistant:

void addStorage()
    {
        Q_ASSERT(allocated < SpanConstants::NEntries);
        Q_ASSERT(nextFree == allocated);
        // the hash table should always be between 25 and 50% full
        // this implies that we on average have between 32 and 64 entries
        // in here. More exactly, we have a binominal distribution of the amount of
        // occupied entries.
        // For a 25% filled table, the average is 32 entries, with a 95% chance that we have between
        // 23 and 41 entries.
        // For a 50% filled table, the average is 64 entries, with a 95% chance that we have between
        // 53 and 75 entries.
        // Since we only resize the table once it's 50% filled and we want to avoid copies of
        // data where possible, we initially allocate 48 entries, then resize to 80 entries, after that
        // resize by increments of 16. That way, we usually only get one resize of the table
        // while filling it.
        size_t alloc;
        static_assert(SpanConstants::NEntries % 8 == 0);
        if (!allocated)
            alloc = SpanConstants::NEntries / 8 * 3;
        else if (allocated == SpanConstants::NEntries / 8 * 3)
            alloc = SpanConstants::NEntries / 8 * 5;
        else
            alloc = allocated + SpanConstants::NEntries/8;
        Entry *newEntries = new Entry[alloc];
        // we only add storage if the previous storage was fully filled, so
        // simply copy the old data over
        if constexpr (isRelocatable<Node>()) {
            if (allocated)
                memcpy(newEntries, entries, allocated * sizeof(Entry));
        } else {
            for (size_t i = 0; i < allocated; ++i) {
                new (&newEntries[i].node()) Node(std::move(entries[i].node()));
                entries[i].node().~Node();
            }
        }
        for (size_t i = allocated; i < alloc; ++i) {
            newEntries[i].nextFree() = uchar(i + 1);
        }
        delete[] entries;
        entries = newEntries;
        allocated = uchar(alloc);
    }